

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlContext.cpp
# Opt level: O2

void __thiscall
sf::priv::GlContext::checkSettings(GlContext *this,ContextSettings *requestedSettings)

{
  int iVar1;
  GlFunctionPointer p_Var2;
  char *__s1;
  char *__s1_00;
  ostream *poVar3;
  
  p_Var2 = getFunction("glGetString");
  if (p_Var2 == (GlFunctionPointer)0x0) {
    poVar3 = err();
    poVar3 = std::operator<<(poVar3,"Could not load glGetString function");
  }
  else {
    __s1 = (char *)(*p_Var2)(0x1f00);
    __s1_00 = (char *)(*p_Var2)(0x1f01);
    if (__s1_00 != (char *)0x0 && __s1 != (char *)0x0) {
      iVar1 = strcmp(__s1,"Microsoft Corporation");
      if (iVar1 == 0) {
        iVar1 = strcmp(__s1_00,"GDI Generic");
        if (iVar1 == 0) {
          poVar3 = err();
          poVar3 = std::operator<<(poVar3,
                                   "Warning: Detected \"Microsoft Corporation GDI Generic\" OpenGL implementation"
                                  );
          poVar3 = std::endl<char,std::char_traits<char>>(poVar3);
          poVar3 = std::operator<<(poVar3,
                                   "The current OpenGL implementation is not hardware-accelerated");
          std::endl<char,std::char_traits<char>>(poVar3);
        }
      }
    }
    if (((((this->m_settings).attributeFlags == requestedSettings->attributeFlags) &&
         ((int)(requestedSettings->majorVersion * 10 + requestedSettings->minorVersion) <=
          (int)((this->m_settings).majorVersion * 10 + (this->m_settings).minorVersion))) &&
        (requestedSettings->stencilBits <= (this->m_settings).stencilBits)) &&
       (((requestedSettings->antialiasingLevel <= (this->m_settings).antialiasingLevel &&
         (requestedSettings->depthBits <= (this->m_settings).depthBits)) &&
        (((this->m_settings).sRgbCapable != false || (requestedSettings->sRgbCapable != true)))))) {
      return;
    }
    poVar3 = err();
    poVar3 = std::operator<<(poVar3,
                             "Warning: The created OpenGL context does not fully meet the settings that were requested"
                            );
    std::endl<char,std::char_traits<char>>(poVar3);
    poVar3 = err();
    poVar3 = std::operator<<(poVar3,"Requested: version = ");
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    poVar3 = std::operator<<(poVar3,".");
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    poVar3 = std::operator<<(poVar3," ; depth bits = ");
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    poVar3 = std::operator<<(poVar3," ; stencil bits = ");
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    poVar3 = std::operator<<(poVar3," ; AA level = ");
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    *(uint *)(&poVar3->field_0x18 + (long)poVar3->_vptr_basic_ostream[-3]) =
         *(uint *)(&poVar3->field_0x18 + (long)poVar3->_vptr_basic_ostream[-3]) | 1;
    poVar3 = std::operator<<(poVar3," ; core = ");
    poVar3 = std::ostream::_M_insert<bool>(SUB81(poVar3,0));
    poVar3 = std::operator<<(poVar3," ; debug = ");
    poVar3 = std::ostream::_M_insert<bool>(SUB81(poVar3,0));
    poVar3 = std::operator<<(poVar3," ; sRGB = ");
    poVar3 = std::ostream::_M_insert<bool>(SUB81(poVar3,0));
    *(uint *)(&poVar3->field_0x18 + (long)poVar3->_vptr_basic_ostream[-3]) =
         *(uint *)(&poVar3->field_0x18 + (long)poVar3->_vptr_basic_ostream[-3]) & 0xfffffffe;
    std::endl<char,std::char_traits<char>>(poVar3);
    poVar3 = err();
    poVar3 = std::operator<<(poVar3,"Created: version = ");
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    poVar3 = std::operator<<(poVar3,".");
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    poVar3 = std::operator<<(poVar3," ; depth bits = ");
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    poVar3 = std::operator<<(poVar3," ; stencil bits = ");
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    poVar3 = std::operator<<(poVar3," ; AA level = ");
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    *(uint *)(&poVar3->field_0x18 + (long)poVar3->_vptr_basic_ostream[-3]) =
         *(uint *)(&poVar3->field_0x18 + (long)poVar3->_vptr_basic_ostream[-3]) | 1;
    poVar3 = std::operator<<(poVar3," ; core = ");
    poVar3 = std::ostream::_M_insert<bool>(SUB81(poVar3,0));
    poVar3 = std::operator<<(poVar3," ; debug = ");
    poVar3 = std::ostream::_M_insert<bool>(SUB81(poVar3,0));
    poVar3 = std::operator<<(poVar3," ; sRGB = ");
    poVar3 = std::ostream::_M_insert<bool>(SUB81(poVar3,0));
    *(uint *)(&poVar3->field_0x18 + (long)poVar3->_vptr_basic_ostream[-3]) =
         *(uint *)(&poVar3->field_0x18 + (long)poVar3->_vptr_basic_ostream[-3]) & 0xfffffffe;
  }
  std::endl<char,std::char_traits<char>>(poVar3);
  return;
}

Assistant:

void GlContext::checkSettings(const ContextSettings& requestedSettings)
{
    // Perform checks to inform the user if they are getting a context they might not have expected

    glGetStringFuncType glGetStringFunc = reinterpret_cast<glGetStringFuncType>(getFunction("glGetString"));

    if (!glGetStringFunc)
    {
        err() << "Could not load glGetString function" << std::endl;

        return;
    }

    // Detect any known non-accelerated implementations and warn
    const char* vendorName = reinterpret_cast<const char*>(glGetStringFunc(GL_VENDOR));
    const char* rendererName = reinterpret_cast<const char*>(glGetStringFunc(GL_RENDERER));

    if (vendorName && rendererName)
    {
        if ((std::strcmp(vendorName, "Microsoft Corporation") == 0) && (std::strcmp(rendererName, "GDI Generic") == 0))
        {
            err() << "Warning: Detected \"Microsoft Corporation GDI Generic\" OpenGL implementation" << std::endl
                  << "The current OpenGL implementation is not hardware-accelerated" << std::endl;
        }
    }

    int version = static_cast<int>(m_settings.majorVersion * 10u + m_settings.minorVersion);
    int requestedVersion = static_cast<int>(requestedSettings.majorVersion * 10u + requestedSettings.minorVersion);

    if ((m_settings.attributeFlags    != requestedSettings.attributeFlags)    ||
        (version                      <  requestedVersion)                    ||
        (m_settings.stencilBits       <  requestedSettings.stencilBits)       ||
        (m_settings.antialiasingLevel <  requestedSettings.antialiasingLevel) ||
        (m_settings.depthBits         <  requestedSettings.depthBits)         ||
        (!m_settings.sRgbCapable      && requestedSettings.sRgbCapable))
    {
        err() << "Warning: The created OpenGL context does not fully meet the settings that were requested" << std::endl;
        err() << "Requested: version = " << requestedSettings.majorVersion << "." << requestedSettings.minorVersion
              << " ; depth bits = " << requestedSettings.depthBits
              << " ; stencil bits = " << requestedSettings.stencilBits
              << " ; AA level = " << requestedSettings.antialiasingLevel
              << std::boolalpha
              << " ; core = " << ((requestedSettings.attributeFlags & ContextSettings::Core) != 0)
              << " ; debug = " << ((requestedSettings.attributeFlags & ContextSettings::Debug) != 0)
              << " ; sRGB = " << requestedSettings.sRgbCapable
              << std::noboolalpha << std::endl;
        err() << "Created: version = " << m_settings.majorVersion << "." << m_settings.minorVersion
              << " ; depth bits = " << m_settings.depthBits
              << " ; stencil bits = " << m_settings.stencilBits
              << " ; AA level = " << m_settings.antialiasingLevel
              << std::boolalpha
              << " ; core = " << ((m_settings.attributeFlags & ContextSettings::Core) != 0)
              << " ; debug = " << ((m_settings.attributeFlags & ContextSettings::Debug) != 0)
              << " ; sRGB = " << m_settings.sRgbCapable
              << std::noboolalpha << std::endl;
    }
}